

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2raster.cpp
# Opt level: O2

bool32 rw::ps2::imageFindRasterFormat
                 (Image *img,int32 type,int32 *pWidth,int32 *pHeight,int32 *pDepth,int32 *pFormat)

{
  FILE *__stream;
  char *pcVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Error _e;
  
  iVar3 = 1;
  do {
    iVar4 = iVar3;
    iVar3 = iVar4 * 2;
  } while (iVar4 < img->width);
  iVar3 = 1;
  do {
    iVar2 = iVar3;
    iVar3 = iVar2 * 2;
  } while (iVar2 < img->height);
  iVar3 = img->depth;
  switch(iVar3 << 0x1e | iVar3 - 4U >> 2) {
  case 0:
    uVar5 = 0x4500;
    break;
  case 1:
    uVar5 = 0x2500;
    break;
  default:
    _e.plugin = 0xb00;
    _e.code = 0x8000000a;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/ps2/ps2raster.cpp",
            0x641);
    __stream = _stderr;
    pcVar1 = dbgsprint(0x8000000a);
    fprintf(__stream,"%s\n",pcVar1);
    setError(&_e);
    return 0;
  case 3:
    uVar5 = 0x100;
    break;
  case 5:
  case 7:
    uVar5 = 0x500;
    iVar3 = 0x20;
  }
  *pWidth = iVar4;
  *pHeight = iVar2;
  *pDepth = iVar3;
  *pFormat = uVar5 | type;
  return 1;
}

Assistant:

bool32
imageFindRasterFormat(Image *img, int32 type,
	int32 *pWidth, int32 *pHeight, int32 *pDepth, int32 *pFormat)
{
	int32 width, height, depth, format;

	assert((type&0xF) == Raster::TEXTURE);

	for(width = 1; width < img->width; width <<= 1);
	for(height = 1; height < img->height; height <<= 1);

	depth = img->depth;

	switch(depth){
	case 32:
	case 24:
		// C888 24 bit is unsafe
		format = Raster::C8888;
		depth = 32;
		break;
	case 16:
		format = Raster::C1555;
		break;
	case 8:
		format = Raster::PAL8 | Raster::C8888;
		break;
	case 4:
		format = Raster::PAL4 | Raster::C8888;
		break;
	default:
		RWERROR((ERR_INVRASTER));
		return 0;
	}

	format |= type;

	*pWidth = width;
	*pHeight = height;
	*pDepth = depth;
	*pFormat = format;

	return 1;
}